

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O2

void __thiscall cubeb_async_logger::start(cubeb_async_logger *this)

{
  ring_buffer_base<cubeb_log_message> *this_00;
  
  this_00 = (ring_buffer_base<cubeb_log_message> *)operator_new(0x18);
  ring_buffer_base<cubeb_log_message>::ring_buffer_base(this_00,0x28);
  LOCK();
  (this->msg_queue)._M_b._M_p = this_00;
  UNLOCK();
  LOCK();
  (this->msg_queue_consumer)._M_b._M_p = this_00;
  UNLOCK();
  LOCK();
  (this->shutdown_thread)._M_base._M_i = false;
  UNLOCK();
  run(this);
  return;
}

Assistant:

void start()
  {
    auto * queue =
        new lock_free_queue<cubeb_log_message>(CUBEB_LOG_MESSAGE_QUEUE_DEPTH);
    msg_queue.store(queue);
    msg_queue_consumer.store(queue);
    shutdown_thread = false;
    run();
  }